

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::CurrencyPluralInfoAffixProvider::setTo
          (CurrencyPluralInfoAffixProvider *this,CurrencyPluralInfo *cpi,
          DecimalFormatProperties *properties,UErrorCode *status)

{
  char *codepageData;
  UnicodeString *src;
  UErrorCode *extraout_RDX;
  long lVar1;
  PropertiesAffixPatternProvider *this_00;
  UnicodeString patternString;
  DecimalFormatProperties pluralProperties;
  UnicodeString local_3a8;
  UnicodeString local_368;
  DecimalFormatProperties local_328;
  
  this->fBogus = false;
  DecimalFormatProperties::DecimalFormatProperties(&local_328,properties);
  this_00 = this->affixesByPlural;
  lVar1 = 0;
  do {
    codepageData = StandardPlural::getKeyword((Form)lVar1);
    local_3a8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
    local_3a8.fUnion.fStackFields.fLengthAndFlags = 2;
    UnicodeString::UnicodeString(&local_368,codepageData);
    src = CurrencyPluralInfo::getCurrencyPluralPattern(cpi,&local_368,&local_3a8);
    UnicodeString::operator=(&local_3a8,src);
    UnicodeString::~UnicodeString(&local_368);
    PatternParser::parseToExistingProperties(&local_3a8,&local_328,IGNORE_ROUNDING_NEVER,status);
    PropertiesAffixPatternProvider::setTo(this_00,&local_328,extraout_RDX);
    UnicodeString::~UnicodeString(&local_3a8);
    lVar1 = lVar1 + 1;
    this_00 = this_00 + 1;
  } while (lVar1 != 6);
  DecimalFormatProperties::~DecimalFormatProperties(&local_328);
  return;
}

Assistant:

void CurrencyPluralInfoAffixProvider::setTo(const CurrencyPluralInfo& cpi,
                                            const DecimalFormatProperties& properties,
                                            UErrorCode& status) {
    // We need to use a PropertiesAffixPatternProvider, not the simpler version ParsedPatternInfo,
    // because user-specified affix overrides still need to work.
    fBogus = false;
    DecimalFormatProperties pluralProperties(properties);
    for (int32_t plural = 0; plural < StandardPlural::COUNT; plural++) {
        const char* keyword = StandardPlural::getKeyword(static_cast<StandardPlural::Form>(plural));
        UnicodeString patternString;
        patternString = cpi.getCurrencyPluralPattern(keyword, patternString);
        PatternParser::parseToExistingProperties(
                patternString,
                pluralProperties,
                IGNORE_ROUNDING_NEVER,
                status);
        affixesByPlural[plural].setTo(pluralProperties, status);
    }
}